

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlRegFreeRegexp(xmlRegexpPtr regexp)

{
  xmlRegStatePtr *ppxVar1;
  xmlRegAtomPtr *ppxVar2;
  xmlChar **ppxVar3;
  long lVar4;
  
  if (regexp != (xmlRegexpPtr)0x0) {
    if (regexp->string != (xmlChar *)0x0) {
      (*xmlFree)(regexp->string);
    }
    ppxVar1 = regexp->states;
    if (ppxVar1 != (xmlRegStatePtr *)0x0) {
      if (0 < regexp->nbStates) {
        lVar4 = 0;
        do {
          xmlRegFreeState(regexp->states[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 < regexp->nbStates);
        ppxVar1 = regexp->states;
      }
      (*xmlFree)(ppxVar1);
    }
    ppxVar2 = regexp->atoms;
    if (ppxVar2 != (xmlRegAtomPtr *)0x0) {
      if (0 < regexp->nbAtoms) {
        lVar4 = 0;
        do {
          xmlRegFreeAtom(regexp->atoms[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 < regexp->nbAtoms);
        ppxVar2 = regexp->atoms;
      }
      (*xmlFree)(ppxVar2);
    }
    if (regexp->counters != (xmlRegCounter *)0x0) {
      (*xmlFree)(regexp->counters);
    }
    if (regexp->compact != (int *)0x0) {
      (*xmlFree)(regexp->compact);
    }
    if (regexp->transdata != (void **)0x0) {
      (*xmlFree)(regexp->transdata);
    }
    ppxVar3 = regexp->stringMap;
    if (ppxVar3 != (xmlChar **)0x0) {
      if (0 < regexp->nbstrings) {
        lVar4 = 0;
        do {
          (*xmlFree)(regexp->stringMap[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 < regexp->nbstrings);
        ppxVar3 = regexp->stringMap;
      }
      (*xmlFree)(ppxVar3);
    }
    (*xmlFree)(regexp);
    return;
  }
  return;
}

Assistant:

void
xmlRegFreeRegexp(xmlRegexpPtr regexp) {
    int i;
    if (regexp == NULL)
	return;

    if (regexp->string != NULL)
	xmlFree(regexp->string);
    if (regexp->states != NULL) {
	for (i = 0;i < regexp->nbStates;i++)
	    xmlRegFreeState(regexp->states[i]);
	xmlFree(regexp->states);
    }
    if (regexp->atoms != NULL) {
	for (i = 0;i < regexp->nbAtoms;i++)
	    xmlRegFreeAtom(regexp->atoms[i]);
	xmlFree(regexp->atoms);
    }
    if (regexp->counters != NULL)
	xmlFree(regexp->counters);
    if (regexp->compact != NULL)
	xmlFree(regexp->compact);
    if (regexp->transdata != NULL)
	xmlFree(regexp->transdata);
    if (regexp->stringMap != NULL) {
	for (i = 0; i < regexp->nbstrings;i++)
	    xmlFree(regexp->stringMap[i]);
	xmlFree(regexp->stringMap);
    }

    xmlFree(regexp);
}